

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::InstrumentPass::Gen32BitCvtCode
          (InstrumentPass *this,uint32_t val_id,InstructionBuilder *builder)

{
  char cVar1;
  IRContext *this_00;
  TypeManager *this_01;
  Analysis AVar2;
  uint32_t uVar3;
  int iVar4;
  Instruction *pIVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  IRContext *this_02;
  Integer val_32b_ty;
  Type local_60;
  char local_38;
  
  this_00 = (this->super_Pass).context_;
  AVar2 = this_00->valid_analyses_;
  this_02 = this_00;
  if (-1 < (short)AVar2) {
    IRContext::BuildTypeManager(this_00);
    this_02 = (this->super_Pass).context_;
    AVar2 = this_02->valid_analyses_;
  }
  this_01 = (this_00->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if ((AVar2 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_02);
  }
  pIVar5 = analysis::DefUseManager::GetDef
                     ((this_02->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,val_id);
  uVar3 = 0;
  if (pIVar5->has_type_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(pIVar5,0);
  }
  pTVar6 = analysis::TypeManager::GetType(this_01,uVar3);
  iVar4 = (*pTVar6->_vptr_Type[9])(pTVar6);
  if (*(int *)(CONCAT44(extraout_var,iVar4) + 0x24) == 0x20) {
    return val_id;
  }
  cVar1 = *(char *)(CONCAT44(extraout_var,iVar4) + 0x28);
  local_60.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.kind_ = kInteger;
  local_60._36_4_ = 0x20;
  local_60._vptr_Type = (_func_int **)&PTR__Type_003db8d0;
  local_38 = cVar1;
  pTVar6 = analysis::TypeManager::GetRegisteredType(this_01,&local_60);
  uVar3 = analysis::TypeManager::GetId(this_01,pTVar6);
  if (cVar1 == '\x01') {
    pIVar5 = InstructionBuilder::AddUnaryOp(builder,uVar3,OpSConvert,val_id);
    if (pIVar5->has_result_id_ != false) {
LAB_00227f33:
      uVar3 = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
      goto LAB_00227f57;
    }
  }
  else {
    pIVar5 = InstructionBuilder::AddUnaryOp(builder,uVar3,OpUConvert,val_id);
    if (pIVar5->has_result_id_ == true) goto LAB_00227f33;
  }
  uVar3 = 0;
LAB_00227f57:
  local_60._vptr_Type = (_func_int **)&PTR__Type_003d7f68;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_60.decorations_);
  return uVar3;
}

Assistant:

uint32_t InstrumentPass::Gen32BitCvtCode(uint32_t val_id,
                                         InstructionBuilder* builder) {
  // Convert integer value to 32-bit if necessary
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  uint32_t val_ty_id = get_def_use_mgr()->GetDef(val_id)->type_id();
  analysis::Integer* val_ty = type_mgr->GetType(val_ty_id)->AsInteger();
  if (val_ty->width() == 32) return val_id;
  bool is_signed = val_ty->IsSigned();
  analysis::Integer val_32b_ty(32, is_signed);
  analysis::Type* val_32b_reg_ty = type_mgr->GetRegisteredType(&val_32b_ty);
  uint32_t val_32b_reg_ty_id = type_mgr->GetId(val_32b_reg_ty);
  if (is_signed)
    return builder->AddUnaryOp(val_32b_reg_ty_id, spv::Op::OpSConvert, val_id)
        ->result_id();
  else
    return builder->AddUnaryOp(val_32b_reg_ty_id, spv::Op::OpUConvert, val_id)
        ->result_id();
}